

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestApp.cpp
# Opt level: O1

void ProcessPageRequest(Page *page,char *url)

{
  int iVar1;
  code *content;
  
  iVar1 = strcasecmp(url,"/");
  if (iVar1 == 0) {
    content = HomePage;
  }
  else {
    iVar1 = strcasecmp(url,"/forms");
    if (iVar1 == 0) {
      content = FormsDemo;
    }
    else {
      iVar1 = strcasecmp(url,"/formsresult");
      if (iVar1 == 0) {
        content = FormsResponse;
      }
      else {
        iVar1 = strcasecmp(url,"/show/mac");
        if (iVar1 == 0) {
          content = ShowMAC;
        }
        else {
          iVar1 = strcasecmp(url,"/show/ip");
          if (iVar1 == 0) {
            content = ShowIP;
          }
          else {
            iVar1 = strcasecmp(url,"/show/arp");
            if (iVar1 == 0) {
              content = ShowARP;
            }
            else {
              iVar1 = strcasecmp(url,"/show/tcp");
              if (iVar1 == 0) {
                content = ShowTCP;
              }
              else {
                iVar1 = strcasecmp(url,"/show/thread");
                if (iVar1 == 0) {
                  content = ShowThread;
                }
                else {
                  iVar1 = strcasecmp(url,"/show/queue");
                  if (iVar1 == 0) {
                    content = ShowQueue;
                  }
                  else {
                    iVar1 = strcasecmp(url,"/show/event");
                    if (iVar1 == 0) {
                      content = ShowEvent;
                    }
                    else {
                      iVar1 = strcasecmp(url,"/show/mutex");
                      if (iVar1 != 0) {
                        http::Page::PageNotFound(page);
                        return;
                      }
                      content = ShowMutex;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  http::Page::Process(page,
                      "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/build_O1/test_app/master.html"
                      ,"$content",content);
  return;
}

Assistant:

void ProcessPageRequest(http::Page* page, const char* url)
{
    if (!strcasecmp(url, "/"))
    {
        page->Process(BINARY_DIR "master.html", "$content", HomePage);
    }
    else if (!strcasecmp(url, "/forms"))
    {
        page->Process(BINARY_DIR "master.html", "$content", FormsDemo);
    }
    else if (!strcasecmp(url, "/formsresult"))
    {
        page->Process(BINARY_DIR "master.html", "$content", FormsResponse);
    }
    //   else if( !strcasecmp( url, "/files/test1.zip" ) )
    //   {
    //      page->PageOK();
    //      page->SendFile( "c:\\test.rar" );
    //   }
    //   else if( !strcasecmp( url, "/test/uploadfile" ) )
    //   {
    //      printf( "Reading %d bytes\n", page->ContentLength );
    //      for( int i = 0; i<page->ContentLength; i++ )
    //      {
    //         page->Connection->Read();
    //      }
    //      printf( "Done reading\n" );
    //      page->PageOK();
    //      page->Printf( "Upload %d bytes complete\n", page->ContentLength );
    //   }
    else if (!strcasecmp(url, "/show/mac"))
    {
        page->Process(BINARY_DIR "master.html", "$content", ShowMAC);
    }
    else if (!strcasecmp(url, "/show/ip"))
    {
        page->Process(BINARY_DIR "master.html", "$content", ShowIP);
    }
    else if (!strcasecmp(url, "/show/arp"))
    {
        page->Process(BINARY_DIR "master.html", "$content", ShowARP);
    }
    else if (!strcasecmp(url, "/show/tcp"))
    {
        page->Process(BINARY_DIR "master.html", "$content", ShowTCP);
    }
    else if (!strcasecmp(url, "/show/thread"))
    {
        page->Process(BINARY_DIR "master.html", "$content", ShowThread);
    }
    else if (!strcasecmp(url, "/show/queue"))
    {
        page->Process(BINARY_DIR "master.html", "$content", ShowQueue);
    }
    else if (!strcasecmp(url, "/show/event"))
    {
        page->Process(BINARY_DIR "master.html", "$content", ShowEvent);
    }
    else if (!strcasecmp(url, "/show/mutex"))
    {
        page->Process(BINARY_DIR "master.html", "$content", ShowMutex);
    }
    else
    {
        page->PageNotFound();
    }
}